

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O2

void PatchRandoWorldEdits::alter_palettes_for_miscolored_ground_items(World *world)

{
  Map *pMVar1;
  const_reference ppEVar2;
  uint8_t i;
  size_type sVar3;
  
  sVar3 = 2;
  while( true ) {
    pMVar1 = World::map(world,0x234);
    if (sVar3 == 6) break;
    ppEVar2 = std::vector<Entity_*,_std::allocator<Entity_*>_>::at(&pMVar1->_entities,sVar3);
    ((*ppEVar2)->_attrs).palette = '\0';
    sVar3 = sVar3 + 1;
  }
  ppEVar2 = std::vector<Entity_*,_std::allocator<Entity_*>_>::at(&pMVar1->_entities,0);
  ((*ppEVar2)->_attrs).palette = '\x01';
  pMVar1 = World::map(world,0x19f);
  ppEVar2 = std::vector<Entity_*,_std::allocator<Entity_*>_>::at(&pMVar1->_entities,0);
  ((*ppEVar2)->_attrs).palette = '\0';
  for (sVar3 = 1; sVar3 != 3; sVar3 = sVar3 + 1) {
    pMVar1 = World::map(world,0x19f);
    ppEVar2 = std::vector<Entity_*,_std::allocator<Entity_*>_>::at(&pMVar1->_entities,sVar3);
    ((*ppEVar2)->_attrs).palette = '\x01';
  }
  return;
}

Assistant:

static void alter_palettes_for_miscolored_ground_items(World& world)
    {
        // Force trees to use environmental palette
        for(uint8_t i=2 ; i<=5 ; ++i)
            world.map(MAP_GREENMAZE_SUNSTONE)->entities().at(i)->palette(0);
        // Put item back on its appropriate palette
        world.map(MAP_GREENMAZE_SUNSTONE)->entities().at(0)->palette(1);

        // Force tree to use environmental palette
        world.map(MAP_KN_LABYRINTH_TREE_LOGS)->entities().at(0)->palette(0);
        // Put items back on their appropriate palette
        for(uint8_t i=1 ; i<=2 ; ++i)
            world.map(MAP_KN_LABYRINTH_TREE_LOGS)->entities().at(i)->palette(1);
    }